

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_minotaur.cpp
# Opt level: O1

int AF_A_MinotaurRoam(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  AActor *actor;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  undefined8 uVar6;
  PClass *pPVar7;
  undefined4 extraout_var_00;
  char cVar8;
  AMinotaurFriend *self1;
  VMValue *pVVar9;
  char *__assertion;
  FString *this;
  long lVar10;
  bool bVar11;
  VMValue params [3];
  FName local_74;
  DAngle local_70;
  anon_union_16_5_cf148060_for_VMValue_0 local_68;
  AActor *local_58;
  undefined4 local_50;
  undefined1 local_4c;
  FString local_48;
  undefined4 local_40;
  char local_3c [12];
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005c6cd1;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    actor = (AActor *)(param->field_0).field_1.a;
    pVVar9 = param;
    uVar5 = numparam;
    if (actor != (AActor *)0x0) {
      if ((actor->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar4 = (**(actor->super_DThinker).super_DObject._vptr_DObject)(actor);
        (actor->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
      }
      pPVar7 = (actor->super_DThinker).super_DObject.Class;
      bVar11 = pPVar7 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar11;
      uVar5 = (uint)bVar11;
      pVVar9 = (VMValue *)(ulong)(pPVar7 == pPVar3 || bVar11);
      if (pPVar7 != pPVar3 && !bVar11) {
        do {
          pPVar7 = pPVar7->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar7 != (PClass *)0x0);
          if (pPVar7 == pPVar3) break;
        } while (pPVar7 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005c6cd1;
      }
    }
    pPVar3 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
      if ((VVar1 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005c6ca6;
      puVar2 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar2 != (undefined8 *)0x0) {
        if (puVar2[1] == 0) {
          uVar6 = (**(code **)*puVar2)(puVar2,pVVar9,uVar5,ret);
          puVar2[1] = uVar6;
        }
        pPVar7 = (PClass *)puVar2[1];
        bVar11 = pPVar7 != (PClass *)0x0;
        if (pPVar7 != pPVar3 && bVar11) {
          do {
            pPVar7 = pPVar7->ParentClass;
            bVar11 = pPVar7 != (PClass *)0x0;
            if (pPVar7 == pPVar3) break;
          } while (pPVar7 != (PClass *)0x0);
        }
        if (!bVar11) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005c6cd1;
        }
      }
    }
    if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
       ((VVar1 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      actor->RenderStyle = LegacyRenderStyles[1];
      pPVar3 = AMinotaurFriend::RegistrationInfo.MyClass;
      if ((actor->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar4 = (**(actor->super_DThinker).super_DObject._vptr_DObject)(actor);
        (actor->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_00,iVar4);
      }
      pPVar7 = (actor->super_DThinker).super_DObject.Class;
      bVar11 = pPVar7 != (PClass *)0x0;
      if (pPVar7 != pPVar3 && bVar11) {
        do {
          pPVar7 = pPVar7->ParentClass;
          bVar11 = pPVar7 != (PClass *)0x0;
          if (pPVar7 == pPVar3) break;
        } while (pPVar7 != (PClass *)0x0);
      }
      if (((bVar11) && (-1 < *(int *)&actor->field_0x49c)) &&
         (0x36a < level.maptime - *(int *)&actor->field_0x49c)) {
        local_74.Index = 0;
        local_70.Degrees = 0.0;
        P_DamageMobj(actor,(AActor *)0x0,(AActor *)0x0,1000000,&local_74,0,&local_70);
      }
      else {
        uVar5 = FRandom::GenRand32(&pr_minotaurroam);
        if ((uVar5 & 0xfe) < 0x1e) {
          local_68.field_1.atag = 1;
          local_68.field_3.Type = '\x03';
          local_50 = 1;
          local_4c = 3;
          local_48.Chars = (char *)0x0;
          local_40 = 8;
          local_3c[0] = 3;
          local_68.field_1.a = actor;
          local_58 = actor;
          VMFrameStack::Call(stack,&A_MinotaurLook_VMPtr->super_VMFunction,
                             (VMValue *)&local_68.field_1,3,(VMReturn *)0x0,0,(VMException **)0x0);
          lVar10 = -0x30;
          this = &local_48;
          do {
            if (*(char *)((long)&this[1].Chars + 4) == '\x02') {
              FString::~FString(this);
            }
            this = this + -2;
            lVar10 = lVar10 + 0x10;
          } while (lVar10 != 0);
        }
        uVar5 = FRandom::GenRand32(&pr_minotaurroam);
        if ((uVar5 & 0xfe) < 6) {
          uVar5 = FRandom::GenRand32(&pr_minotaurroam);
          actor->movedir = (byte)uVar5 & 7;
          FaceMovementDirection(actor);
        }
        bVar11 = P_Move(actor);
        if (!bVar11) {
          uVar5 = FRandom::GenRand32(&pr_minotaurroam);
          cVar8 = '\x01';
          if ((uVar5 & 1) == 0) {
            cVar8 = '\a';
          }
          actor->movedir = cVar8 + actor->movedir & 7;
          FaceMovementDirection(actor);
        }
      }
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005c6ca6:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005c6cd1:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_raven/a_minotaur.cpp"
                ,0x1bd,"int AF_A_MinotaurRoam(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_MinotaurRoam)
{
	PARAM_ACTION_PROLOGUE;

	// In case pain caused him to skip his fade in.
	self->RenderStyle = STYLE_Normal;

	if (self->IsKindOf(RUNTIME_CLASS(AMinotaurFriend)))
	{
		AMinotaurFriend *self1 = static_cast<AMinotaurFriend *> (self);

		if (self1->StartTime >= 0 && (level.maptime - self1->StartTime) >= MAULATORTICS)
		{
			P_DamageMobj (self1, NULL, NULL, TELEFRAG_DAMAGE, NAME_None);
			return 0;
		}
	}

	if (pr_minotaurroam() < 30)
		CALL_ACTION(A_MinotaurLook, self);		// adjust to closest target

	if (pr_minotaurroam() < 6)
	{
		//Choose new direction
		self->movedir = pr_minotaurroam() % 8;
		FaceMovementDirection (self);
	}
	if (!P_Move(self))
	{
		// Turn
		if (pr_minotaurroam() & 1)
			self->movedir = (self->movedir + 1) % 8;
		else
			self->movedir = (self->movedir + 7) % 8;
		FaceMovementDirection (self);
	}
	return 0;
}